

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Ptr * __thiscall
spectest::CommandRunner::ReadModule
          (Ptr *__return_storage_ptr__,CommandRunner *this,string_view module_filename,
          Errors *errors)

{
  Result RVar1;
  string_view filename;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  ReadBinaryOptions options;
  ModuleDesc module_desc;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_2a8;
  ReadBinaryOptions local_288;
  ModuleDesc local_268;
  ModuleDesc local_148;
  
  local_2a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  filename.size_ = (size_type)&local_2a8;
  filename.data_ = (char *)module_filename.size_;
  RVar1 = wabt::ReadFile((wabt *)module_filename.data_,filename,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         module_filename.size_);
  if (RVar1.enum_ == Error) {
    __return_storage_ptr__->obj_ = (Module *)0x0;
    __return_storage_ptr__->store_ = (Store *)0x0;
    __return_storage_ptr__->root_index_ = 0;
  }
  else {
    local_288.features.exceptions_enabled_ = s_features.exceptions_enabled_;
    local_288.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
    local_288.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
    local_288.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
    local_288.features.simd_enabled_ = s_features.simd_enabled_;
    local_288.features.threads_enabled_ = s_features.threads_enabled_;
    local_288.features.multi_value_enabled_ = s_features.multi_value_enabled_;
    local_288.features.tail_call_enabled_ = s_features.tail_call_enabled_;
    local_288.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
    local_288.features.reference_types_enabled_ = s_features.reference_types_enabled_;
    local_288.features.annotations_enabled_ = s_features.annotations_enabled_;
    local_288.features.gc_enabled_ = s_features.gc_enabled_;
    local_288.features.memory64_enabled_ = s_features.memory64_enabled_;
    local_288.log_stream =
         (Stream *)
         s_log_stream._M_t.
         super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
         super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
         super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
    local_288.read_debug_names = true;
    local_288.stop_on_first_error = true;
    local_288.fail_on_custom_section_error = true;
    memset(&local_268,0,0x120);
    RVar1 = wabt::interp::ReadBinaryInterp
                      (local_2a8._M_impl.super__Vector_impl_data._M_start,
                       (long)local_2a8._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_2a8._M_impl.super__Vector_impl_data._M_start,&local_288,errors,
                       &local_268);
    if (RVar1.enum_ == Error) {
      __return_storage_ptr__->obj_ = (Module *)0x0;
      __return_storage_ptr__->store_ = (Store *)0x0;
      __return_storage_ptr__->root_index_ = 0;
    }
    else {
      if (s_verbose != 0) {
        wabt::interp::Istream::Disassemble
                  (&local_268.istream,
                   (Stream *)
                   s_stdout_stream._M_t.
                   super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                   .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl);
      }
      wabt::interp::ModuleDesc::ModuleDesc(&local_148,&local_268);
      wabt::interp::Module::New(__return_storage_ptr__,&this->store_,&local_148);
      wabt::interp::ModuleDesc::~ModuleDesc(&local_148);
    }
    wabt::interp::ModuleDesc::~ModuleDesc(&local_268);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_2a8);
  return __return_storage_ptr__;
}

Assistant:

interp::Module::Ptr CommandRunner::ReadModule(string_view module_filename,
                                               Errors* errors) {
  std::vector<uint8_t> file_data;

  if (Failed(ReadFile(module_filename, &file_data))) {
    return {};
  }

  const bool kReadDebugNames = true;
  const bool kStopOnFirstError = true;
  const bool kFailOnCustomSectionError = true;
  ReadBinaryOptions options(s_features, s_log_stream.get(), kReadDebugNames,
                            kStopOnFirstError, kFailOnCustomSectionError);
  ModuleDesc module_desc;
  if (Failed(ReadBinaryInterp(file_data.data(), file_data.size(), options,
                              errors, &module_desc))) {
    return {};
  }

  if (s_verbose) {
    module_desc.istream.Disassemble(s_stdout_stream.get());
  }

  return interp::Module::New(store_, module_desc);
}